

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcLocalPlacement::IfcLocalPlacement(IfcLocalPlacement *this)

{
  *(undefined ***)&this->field_0x40 = &PTR__Object_007fca00;
  *(undefined8 *)&this->field_0x48 = 0;
  *(char **)&this->field_0x50 = "IfcLocalPlacement";
  IfcObjectPlacement::IfcObjectPlacement
            ((IfcObjectPlacement *)this,&PTR_construction_vtable_24__008263d0);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).field_0x10 = 0;
  *(undefined8 *)this = 0x826368;
  *(undefined8 *)&this->field_0x40 = 0x8263b8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x826390;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).field_0x18 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).field_0x20 = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  return;
}

Assistant:

IfcLocalPlacement() : Object("IfcLocalPlacement") {}